

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O2

FT_UInt32 tt_cmap6_char_next(TT_CMap cmap,FT_UInt32 *pchar_code)

{
  FT_Byte *pFVar1;
  uint uVar2;
  uint uVar3;
  ushort uVar4;
  ushort *puVar5;
  ushort uVar6;
  
  uVar3 = *pchar_code + 1;
  if (0xffff < uVar3) {
    return 0;
  }
  pFVar1 = cmap->data;
  uVar4 = *(ushort *)(pFVar1 + 6) << 8 | *(ushort *)(pFVar1 + 6) >> 8;
  if (uVar3 <= uVar4) {
    uVar3 = (uint)uVar4;
  }
  puVar5 = (ushort *)(pFVar1 + (ulong)((uVar3 - uVar4) * 2) + 10);
  do {
    if ((uint)(ushort)(*(ushort *)(pFVar1 + 8) << 8 | *(ushort *)(pFVar1 + 8) >> 8) <= uVar3 - uVar4
       ) {
      uVar2 = 0;
      uVar3 = 0;
LAB_002030cd:
      *pchar_code = uVar3;
      return uVar2;
    }
    uVar6 = *puVar5 << 8 | *puVar5 >> 8;
    if (uVar6 != 0) {
      uVar2 = (uint)uVar6;
      goto LAB_002030cd;
    }
    if (0xfffe < uVar3) {
      return 0;
    }
    uVar3 = uVar3 + 1;
    puVar5 = puVar5 + 1;
  } while( true );
}

Assistant:

FT_CALLBACK_DEF( FT_UInt32 )
  tt_cmap6_char_next( TT_CMap     cmap,
                      FT_UInt32  *pchar_code )
  {
    FT_Byte*   table     = cmap->data;
    FT_UInt32  result    = 0;
    FT_UInt32  char_code = *pchar_code + 1;
    FT_UInt    gindex    = 0;

    FT_Byte*   p         = table + 6;
    FT_UInt    start     = TT_NEXT_USHORT( p );
    FT_UInt    count     = TT_NEXT_USHORT( p );
    FT_UInt    idx;


    if ( char_code >= 0x10000UL )
      return 0;

    if ( char_code < start )
      char_code = start;

    idx = (FT_UInt)( char_code - start );
    p  += 2 * idx;

    for ( ; idx < count; idx++ )
    {
      gindex = TT_NEXT_USHORT( p );
      if ( gindex != 0 )
      {
        result = char_code;
        break;
      }

      if ( char_code >= 0xFFFFU )
        return 0;

      char_code++;
    }

    *pchar_code = result;
    return gindex;
  }